

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool __thiscall
llvm::cl::Option::addOccurrence
          (Option *this,uint pos,StringRef ArgName,StringRef Value,bool MultiArg)

{
  StringRef ArgName_00;
  StringRef ArgName_01;
  size_t sVar1;
  bool bVar2;
  NumOccurrencesFlag NVar3;
  int iVar4;
  raw_ostream *prVar5;
  size_t sVar6;
  Twine local_80;
  char *local_68;
  size_t local_60;
  Twine local_58;
  undefined1 local_3d;
  uint local_3c;
  bool MultiArg_local;
  Option *pOStack_38;
  uint pos_local;
  Option *this_local;
  StringRef Value_local;
  StringRef ArgName_local;
  
  Value_local.Data = (char *)Value.Length;
  this_local = (Option *)Value.Data;
  sVar6 = ArgName.Length;
  Value_local.Length = (size_t)ArgName.Data;
  local_3d = MultiArg;
  if (!MultiArg) {
    this->NumOccurrences = this->NumOccurrences + 1;
  }
  local_3c = pos;
  pOStack_38 = this;
  NVar3 = getNumOccurrencesFlag(this);
  switch(NVar3) {
  case Optional:
    if (1 < this->NumOccurrences) {
      Twine::Twine(&local_58,"may only occur zero or one times!");
      local_68 = (char *)Value_local.Length;
      local_60 = sVar6;
      prVar5 = errs();
      ArgName_01.Length = local_60;
      ArgName_01.Data = local_68;
      bVar2 = error(this,&local_58,ArgName_01,prVar5);
      return bVar2;
    }
    break;
  case Required:
    if (1 < this->NumOccurrences) {
      Twine::Twine(&local_80,"must occur exactly one time!");
      sVar1 = Value_local.Length;
      prVar5 = errs();
      ArgName_00.Length = sVar6;
      ArgName_00.Data = (char *)sVar1;
      bVar2 = error(this,&local_80,ArgName_00,prVar5);
      return bVar2;
    }
  case ZeroOrMore:
  case OneOrMore:
  case ConsumeAfter:
  }
  iVar4 = (**this->_vptr_Option)
                    (this,(ulong)local_3c,Value_local.Length,sVar6,this_local,Value_local.Data);
  return (bool)((byte)iVar4 & 1);
}

Assistant:

bool Option::addOccurrence(unsigned pos, StringRef ArgName, StringRef Value,
                           bool MultiArg) {
  if (!MultiArg)
    NumOccurrences++; // Increment the number of times we have been seen

  switch (getNumOccurrencesFlag()) {
  case Optional:
    if (NumOccurrences > 1)
      return error("may only occur zero or one times!", ArgName);
    break;
  case Required:
    if (NumOccurrences > 1)
      return error("must occur exactly one time!", ArgName);
    LLVM_FALLTHROUGH;
  case OneOrMore:
  case ZeroOrMore:
  case ConsumeAfter:
    break;
  }

  return handleOccurrence(pos, ArgName, Value);
}